

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx,pcp_db_server_iterate f,void *data)

{
  int iVar1;
  uint local_24;
  int ret;
  uint32_t indx;
  void *data_local;
  pcp_db_server_iterate f_local;
  pcp_ctx_t *ctx_local;
  
  if ((ctx != (pcp_ctx_t *)0x0) && (f != (pcp_db_server_iterate)0x0)) {
    local_24 = 0;
    while( true ) {
      if ((ctx->pcp_db).pcp_servers_length <= (ulong)local_24) {
        return PCP_ERR_MAX_SIZE;
      }
      if (((ctx->pcp_db).pcp_servers[local_24].server_state != pss_unitialized) &&
         (iVar1 = (*f)((ctx->pcp_db).pcp_servers + local_24,data), iVar1 != 0)) break;
      local_24 = local_24 + 1;
    }
    return PCP_ERR_SUCCESS;
  }
  __assert_fail("ctx && f",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x174,"pcp_errno pcp_db_foreach_server(pcp_ctx_t *, pcp_db_server_iterate, void *)"
               );
}

Assistant:

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx, pcp_db_server_iterate f,
                                void *data) {
    uint32_t indx;
    int ret = PCP_ERR_MAX_SIZE;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(ctx && f);

    for (indx = 0; indx < ctx->pcp_db.pcp_servers_length; ++indx) {
        if (ctx->pcp_db.pcp_servers[indx].server_state == pss_unitialized) {
            continue;
        }
        if ((*f)(ctx->pcp_db.pcp_servers + indx, data)) {
            ret = PCP_ERR_SUCCESS;
            break;
        }
    }
    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return ret;
}